

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_import_segment_info(import_segment sec)

{
  import_pointer paVar1;
  ulong uVar2;
  uint local_34;
  uint local_30;
  int globalCount;
  int memCount;
  int tableCount;
  int funCount;
  int i;
  import_pointer import_segment_addr;
  import_segment sec_local;
  
  memCount = 0;
  globalCount = 0;
  local_30 = 0;
  local_34 = 0;
  for (tableCount = 0; (uint)tableCount < sec.import_segment_count; tableCount = tableCount + 1) {
    paVar1 = sec.import_segment_addr + tableCount;
    switch((paVar1->im_desc).tag) {
    case '\0':
      uVar2 = (ulong)(uint)memCount;
      memCount = memCount + 1;
      printf("  - func[%d]: typeId=%u <%s> <- %s.%s\n",uVar2,
             (ulong)(paVar1->im_desc).field_1.typeIndex,paVar1->name,paVar1->model_name,paVar1->name
            );
      break;
    case '\x01':
      uVar2 = (ulong)(uint)globalCount;
      globalCount = globalCount + 1;
      printf("  - table[%d]: <%s> <- %s.%s\n",uVar2,paVar1->name,paVar1->model_name,paVar1->name);
      break;
    case '\x02':
      uVar2 = (ulong)local_30;
      local_30 = local_30 + 1;
      printf("  - mem[%d]: <%s> <- %s.%s\n",uVar2,paVar1->name,paVar1->model_name,paVar1->name);
      break;
    case '\x03':
      uVar2 = (ulong)local_34;
      local_34 = local_34 + 1;
      printf("  - global[%d]: <%s> <- %s.%s\n",uVar2,paVar1->name,paVar1->model_name,paVar1->name);
    }
  }
  return;
}

Assistant:

void print_import_segment_info(import_segment sec) {
    import_pointer import_segment_addr;
    for (int i = 0, funCount = 0, tableCount = 0, memCount = 0, globalCount = 0; i < sec.import_segment_count; ++i) {
        import_segment_addr = sec.import_segment_addr + i;
        switch (import_segment_addr->im_desc.tag) {
            case func_im_export_tag:
                printf("  - func[%d]: typeId=%u <%s> <- %s.%s\n", funCount++, import_segment_addr->im_desc.typeIndex,
                       import_segment_addr->name,
                       import_segment_addr->model_name, import_segment_addr->name);
                break;
            case table_im_export_tag:
                printf("  - table[%d]: <%s> <- %s.%s\n", tableCount++,
                       import_segment_addr->name,
                       import_segment_addr->model_name, import_segment_addr->name);
                break;
            case mem_im_export_tag:
                printf("  - mem[%d]: <%s> <- %s.%s\n", memCount++,
                       import_segment_addr->name,
                       import_segment_addr->model_name, import_segment_addr->name);
                break;
            case global_im_export_tag:
                printf("  - global[%d]: <%s> <- %s.%s\n", globalCount++,
                       import_segment_addr->name,
                       import_segment_addr->model_name, import_segment_addr->name);
                break;
        }
    }
}